

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

vm_obj_id_t CVmObjFileName::create_from_url(char *str,size_t len)

{
  long lVar1;
  void *pvVar2;
  vm_obj_id_t vVar3;
  char *__s;
  size_t len_00;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_100 [2];
  long local_f8;
  void *local_f0;
  __jmp_buf_tag local_e8;
  
  G_err_frame::__tls_init();
  local_f8 = *in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)local_100;
  local_100[0] = _setjmp(&local_e8);
  if (local_100[0] == 0) {
    __s = url_to_local(str,len,0);
    len_00 = strlen(__s);
    vVar3 = create_from_local(__s,len_00);
  }
  else {
    vVar3 = 0;
    __s = (char *)0x0;
  }
  if (-1 < (short)local_100[0]) {
    local_100[0] = local_100[0] | 0x8000;
    lib_free_str(__s);
  }
  lVar1 = local_f8;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = lVar1;
  if ((local_100[0] & 0x4001) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pvVar2 = local_f0;
    G_err_frame::__tls_init();
    *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_100[0] & 2) != 0) {
    free(local_f0);
  }
  return vVar3;
}

Assistant:

vm_obj_id_t CVmObjFileName::create_from_url(VMG_ const char *str, size_t len)
{
    char *lcl = 0;
    vm_obj_id_t fn = VM_INVALID_OBJ;
    err_try
    {
        /* convert to local notation */
        lcl = url_to_local(vmg_ str, len, FALSE);

        /* create the FileName object */
        fn = create_from_local(vmg_ lcl, strlen(lcl));
    }